

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

void mi_stat_count_add_mt(mi_stat_count_t *stat,mi_stat_count_t *src)

{
  if (stat != src) {
    if (src->total != 0) {
      LOCK();
      stat->total = stat->total + src->total;
      UNLOCK();
    }
    if (src->current != 0) {
      LOCK();
      stat->current = stat->current + src->current;
      UNLOCK();
    }
    if (src->peak != 0) {
      LOCK();
      stat->peak = stat->peak + src->peak;
      UNLOCK();
    }
  }
  return;
}

Assistant:

static void mi_stat_count_add_mt(mi_stat_count_t* stat, const mi_stat_count_t* src) {
  if (stat==src) return;
  mi_atomic_void_addi64_relaxed(&stat->total, &src->total); 
  mi_atomic_void_addi64_relaxed(&stat->current, &src->current); 
  // peak scores do really not work across threads .. we just add them
  mi_atomic_void_addi64_relaxed( &stat->peak, &src->peak);
  // or, take the max?
  // mi_atomic_maxi64_relaxed(&stat->peak, src->peak);
}